

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::TanH_x86_fma::forward_inplace(TanH_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  undefined1 auVar2 [32];
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  undefined1 (*pauVar8) [32];
  long lVar9;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar10;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar18 [64];
  
  iVar1 = bottom_top_blob->c;
  if (0 < (long)iVar1) {
    uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    lVar7 = 0;
    do {
      auVar44._8_4_ = 0x395e8083;
      auVar44._0_8_ = 0x395e8083395e8083;
      auVar41._8_4_ = 0x3f318000;
      auVar41._0_8_ = 0x3f3180003f318000;
      auVar39._8_4_ = 0x3f800000;
      auVar39._0_8_ = 0x3f8000003f800000;
      auVar35._8_4_ = 0x3f000000;
      auVar35._0_8_ = 0x3f0000003f000000;
      auVar33._8_4_ = 0x3d2aa9c1;
      auVar33._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar31._8_4_ = 0x3c088908;
      auVar31._0_8_ = 0x3c0889083c088908;
      auVar30._8_4_ = 0xc0000000;
      auVar30._0_8_ = 0xc0000000c0000000;
      auVar29._8_4_ = 0x3fb8aa3b;
      auVar29._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar27._8_4_ = 0xc2b0c0a5;
      auVar27._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar23._8_4_ = 0x42b0c0a5;
      auVar23._0_8_ = 0x42b0c0a542b0c0a5;
      auVar14._8_4_ = 0x39506967;
      auVar14._0_8_ = 0x3950696739506967;
      auVar44._12_4_ = 0x395e8083;
      auVar41._12_4_ = 0x3f318000;
      auVar39._12_4_ = 0x3f800000;
      auVar35._12_4_ = 0x3f000000;
      auVar33._12_4_ = 0x3d2aa9c1;
      auVar31._12_4_ = 0x3c088908;
      auVar30._12_4_ = 0xc0000000;
      auVar29._12_4_ = 0x3fb8aa3b;
      auVar27._12_4_ = 0xc2b0c0a5;
      auVar23._12_4_ = 0x42b0c0a5;
      auVar14._12_4_ = 0x39506967;
      auVar44._16_4_ = 0x395e8083;
      auVar41._16_4_ = 0x3f318000;
      auVar39._16_4_ = 0x3f800000;
      auVar35._16_4_ = 0x3f000000;
      auVar33._16_4_ = 0x3d2aa9c1;
      auVar31._16_4_ = 0x3c088908;
      auVar30._16_4_ = 0xc0000000;
      auVar29._16_4_ = 0x3fb8aa3b;
      auVar27._16_4_ = 0xc2b0c0a5;
      auVar23._16_4_ = 0x42b0c0a5;
      auVar14._16_4_ = 0x39506967;
      auVar44._20_4_ = 0x395e8083;
      auVar41._20_4_ = 0x3f318000;
      auVar39._20_4_ = 0x3f800000;
      auVar35._20_4_ = 0x3f000000;
      auVar33._20_4_ = 0x3d2aa9c1;
      auVar31._20_4_ = 0x3c088908;
      auVar30._20_4_ = 0xc0000000;
      auVar29._20_4_ = 0x3fb8aa3b;
      auVar27._20_4_ = 0xc2b0c0a5;
      auVar23._20_4_ = 0x42b0c0a5;
      auVar14._20_4_ = 0x39506967;
      auVar44._24_4_ = 0x395e8083;
      auVar41._24_4_ = 0x3f318000;
      auVar39._24_4_ = 0x3f800000;
      auVar35._24_4_ = 0x3f000000;
      auVar33._24_4_ = 0x3d2aa9c1;
      auVar31._24_4_ = 0x3c088908;
      auVar30._24_4_ = 0xc0000000;
      auVar29._24_4_ = 0x3fb8aa3b;
      auVar27._24_4_ = 0xc2b0c0a5;
      auVar23._24_4_ = 0x42b0c0a5;
      auVar14._24_4_ = 0x39506967;
      auVar44._28_4_ = 0x395e8083;
      auVar41._28_4_ = 0x3f318000;
      auVar39._28_4_ = 0x3f800000;
      auVar35._28_4_ = 0x3f000000;
      auVar33._28_4_ = 0x3d2aa9c1;
      auVar31._28_4_ = 0x3c088908;
      auVar30._28_4_ = 0xc0000000;
      auVar29._28_4_ = 0x3fb8aa3b;
      auVar27._28_4_ = 0xc2b0c0a5;
      auVar23._28_4_ = 0x42b0c0a5;
      auVar14._28_4_ = 0x39506967;
      auVar18 = ZEXT3264(auVar14);
      pauVar8 = (undefined1 (*) [32])
                (bottom_top_blob->cstep * lVar7 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      if ((int)uVar6 < 8) {
        uVar4 = 0;
      }
      else {
        iVar3 = 7;
        do {
          auVar19._0_4_ = *(float *)*pauVar8 * -2.0;
          auVar19._4_4_ = *(float *)((long)*pauVar8 + 4) * -2.0;
          auVar19._8_4_ = *(float *)((long)*pauVar8 + 8) * -2.0;
          auVar19._12_4_ = *(float *)((long)*pauVar8 + 0xc) * -2.0;
          auVar19._16_4_ = *(float *)((long)*pauVar8 + 0x10) * -2.0;
          auVar19._20_4_ = *(float *)((long)*pauVar8 + 0x14) * -2.0;
          auVar19._28_36_ = auVar18._28_36_;
          auVar19._24_4_ = *(float *)((long)*pauVar8 + 0x18) * -2.0;
          auVar17 = vminps_avx(auVar19._0_32_,auVar23);
          auVar2 = vmaxps_avx(auVar17,auVar27);
          auVar11 = vfmadd213ps_fma(auVar29,auVar2,auVar35);
          auVar16 = vroundps_avx(ZEXT1632(auVar11),1);
          auVar17 = vcmpps_avx(ZEXT1632(auVar11),auVar16,1);
          auVar17 = vandps_avx(auVar39,auVar17);
          auVar17 = vsubps_avx(auVar16,auVar17);
          auVar11 = vfmsub231ps_fma(auVar2,auVar17,auVar41);
          auVar20 = vfmsub231ps_fma(ZEXT1632(auVar11),auVar17,auVar44);
          auVar15 = ZEXT1632(auVar20);
          auVar2._28_4_ = auVar16._28_4_;
          auVar2._0_28_ =
               ZEXT1628(CONCAT412(auVar20._12_4_ * auVar20._12_4_,
                                  CONCAT48(auVar20._8_4_ * auVar20._8_4_,
                                           CONCAT44(auVar20._4_4_ * auVar20._4_4_,
                                                    auVar20._0_4_ * auVar20._0_4_))));
          auVar46._8_4_ = 0x3ab743ce;
          auVar46._0_8_ = 0x3ab743ce3ab743ce;
          auVar46._12_4_ = 0x3ab743ce;
          auVar46._16_4_ = 0x3ab743ce;
          auVar46._20_4_ = 0x3ab743ce;
          auVar46._24_4_ = 0x3ab743ce;
          auVar46._28_4_ = 0x3ab743ce;
          auVar11 = vfmadd213ps_fma(auVar14,auVar15,auVar46);
          auVar11 = vfmadd213ps_fma(ZEXT1632(auVar11),auVar15,auVar31);
          auVar11 = vfmadd213ps_fma(ZEXT1632(auVar11),auVar15,auVar33);
          auVar47._8_4_ = 0x3e2aaaaa;
          auVar47._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar47._12_4_ = 0x3e2aaaaa;
          auVar47._16_4_ = 0x3e2aaaaa;
          auVar47._20_4_ = 0x3e2aaaaa;
          auVar47._24_4_ = 0x3e2aaaaa;
          auVar47._28_4_ = 0x3e2aaaaa;
          auVar16 = ZEXT1632(auVar20);
          auVar11 = vfmadd213ps_fma(ZEXT1632(auVar11),auVar16,auVar47);
          auVar11 = vfmadd213ps_fma(ZEXT1632(auVar11),auVar16,auVar35);
          auVar34 = vfmadd213ps_fma(ZEXT1632(auVar11),auVar2,auVar16);
          auVar11._0_4_ = (int)auVar17._0_4_;
          auVar11._4_4_ = (int)auVar17._4_4_;
          auVar11._8_4_ = (int)auVar17._8_4_;
          auVar11._12_4_ = (int)auVar17._12_4_;
          auVar16._16_4_ = (int)auVar17._16_4_;
          auVar16._0_16_ = auVar11;
          auVar16._20_4_ = (int)auVar17._20_4_;
          auVar16._24_4_ = (int)auVar17._24_4_;
          auVar16._28_4_ = (int)auVar17._28_4_;
          auVar20 = vpslld_avx(auVar11,0x17);
          auVar11 = vpslld_avx(auVar16._16_16_,0x17);
          auVar36._8_4_ = 0x3f800000;
          auVar36._0_8_ = 0x3f8000003f800000;
          auVar36._12_4_ = 0x3f800000;
          auVar11 = vpaddd_avx(auVar36,auVar11);
          auVar20 = vpaddd_avx(auVar36,auVar20);
          auVar17._16_16_ = auVar11;
          auVar17._0_16_ = auVar20;
          auVar15._0_4_ = auVar34._0_4_ + 1.0;
          auVar15._4_4_ = auVar34._4_4_ + 1.0;
          auVar15._8_4_ = auVar34._8_4_ + 1.0;
          auVar15._12_4_ = auVar34._12_4_ + 1.0;
          auVar15._16_4_ = 0x3f800000;
          auVar15._20_4_ = 0x3f800000;
          auVar15._24_4_ = 0x3f800000;
          auVar15._28_4_ = 0x3f800000;
          auVar11 = vfmadd213ps_fma(auVar17,auVar15,auVar39);
          auVar17 = vrcpps_avx(ZEXT1632(auVar11));
          auVar11 = vfmsub213ps_fma(ZEXT1632(auVar11),auVar17,auVar39);
          auVar11 = vfnmadd132ps_fma(ZEXT1632(auVar11),auVar17,auVar17);
          auVar11 = vfnmsub213ps_fma(ZEXT1632(auVar11),auVar30,auVar39);
          auVar18 = ZEXT1664(auVar11);
          *pauVar8 = ZEXT1632(auVar11);
          pauVar8 = pauVar8 + 1;
          iVar3 = iVar3 + 8;
          uVar4 = uVar6 & 0xfffffff8;
        } while (iVar3 < (int)uVar6);
      }
      auVar20._8_4_ = 0x3f800000;
      auVar20._0_8_ = 0x3f8000003f800000;
      auVar20._12_4_ = 0x3f800000;
      auVar34._8_4_ = 0xc2b0c0a5;
      auVar34._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar34._12_4_ = 0xc2b0c0a5;
      auVar37._8_4_ = 0x3fb8aa3b;
      auVar37._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar37._12_4_ = 0x3fb8aa3b;
      auVar38._8_4_ = 0x3f000000;
      auVar38._0_8_ = 0x3f0000003f000000;
      auVar38._12_4_ = 0x3f000000;
      auVar40._8_4_ = 0x3f318000;
      auVar40._0_8_ = 0x3f3180003f318000;
      auVar40._12_4_ = 0x3f318000;
      auVar42._8_4_ = 0x395e8083;
      auVar42._0_8_ = 0x395e8083395e8083;
      auVar42._12_4_ = 0x395e8083;
      auVar43._8_4_ = 0x3ab743ce;
      auVar43._0_8_ = 0x3ab743ce3ab743ce;
      auVar43._12_4_ = 0x3ab743ce;
      auVar45._8_4_ = 0x39506967;
      auVar45._0_8_ = 0x3950696739506967;
      auVar45._12_4_ = 0x39506967;
      auVar48._8_4_ = 0x3c088908;
      auVar48._0_8_ = 0x3c0889083c088908;
      auVar48._12_4_ = 0x3c088908;
      auVar49._8_4_ = 0x3d2aa9c1;
      auVar49._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar49._12_4_ = 0x3d2aa9c1;
      uVar5 = uVar4 | 3;
      while ((int)uVar5 < (int)uVar6) {
        auVar12._0_4_ = *(float *)*pauVar8 * -2.0;
        auVar12._4_4_ = *(float *)((long)*pauVar8 + 4) * -2.0;
        auVar12._8_4_ = *(float *)((long)*pauVar8 + 8) * -2.0;
        auVar12._12_4_ = *(float *)((long)*pauVar8 + 0xc) * -2.0;
        auVar21._8_4_ = 0x42b0c0a5;
        auVar21._0_8_ = 0x42b0c0a542b0c0a5;
        auVar21._12_4_ = 0x42b0c0a5;
        auVar11 = vminps_avx(auVar12,auVar21);
        auVar12 = vmaxps_avx(auVar11,auVar34);
        auVar11 = vfmadd213ps_fma(auVar37,auVar12,auVar38);
        auVar24._0_4_ = (int)auVar11._0_4_;
        auVar24._4_4_ = (int)auVar11._4_4_;
        auVar24._8_4_ = (int)auVar11._8_4_;
        auVar24._12_4_ = (int)auVar11._12_4_;
        auVar36 = vcvtdq2ps_avx(auVar24);
        auVar11 = vcmpps_avx(auVar11,auVar36,1);
        auVar11 = vandps_avx(auVar11,auVar20);
        auVar11 = vsubps_avx(auVar36,auVar11);
        auVar36 = vfmsub231ps_fma(auVar12,auVar11,auVar40);
        auVar12 = vfmsub231ps_fma(auVar36,auVar11,auVar42);
        auVar25._0_4_ = auVar12._0_4_ * auVar12._0_4_;
        auVar25._4_4_ = auVar12._4_4_ * auVar12._4_4_;
        auVar25._8_4_ = auVar12._8_4_ * auVar12._8_4_;
        auVar25._12_4_ = auVar12._12_4_ * auVar12._12_4_;
        auVar36 = vfmadd213ps_fma(auVar45,auVar12,auVar43);
        auVar36 = vfmadd213ps_fma(auVar36,auVar12,auVar48);
        auVar36 = vfmadd213ps_fma(auVar36,auVar12,auVar49);
        auVar32._8_4_ = 0x3e2aaaaa;
        auVar32._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar32._12_4_ = 0x3e2aaaaa;
        auVar36 = vfmadd213ps_fma(auVar36,auVar12,auVar32);
        auVar36 = vfmadd213ps_fma(auVar36,auVar12,auVar38);
        auVar36 = vfmadd213ps_fma(auVar36,auVar25,auVar12);
        auVar13._0_4_ = auVar36._0_4_ + 1.0;
        auVar13._4_4_ = auVar36._4_4_ + 1.0;
        auVar13._8_4_ = auVar36._8_4_ + 1.0;
        auVar13._12_4_ = auVar36._12_4_ + 1.0;
        auVar22._0_4_ = (int)auVar11._0_4_;
        auVar22._4_4_ = (int)auVar11._4_4_;
        auVar22._8_4_ = (int)auVar11._8_4_;
        auVar22._12_4_ = (int)auVar11._12_4_;
        auVar11 = vpslld_avx(auVar22,0x17);
        auVar11 = vpaddd_avx(auVar11,auVar20);
        auVar36 = vfmadd213ps_fma(auVar11,auVar13,auVar20);
        auVar11 = vrcpps_avx(auVar36);
        auVar26._0_4_ = auVar11._0_4_ + auVar11._0_4_;
        auVar26._4_4_ = auVar11._4_4_ + auVar11._4_4_;
        auVar26._8_4_ = auVar11._8_4_ + auVar11._8_4_;
        auVar26._12_4_ = auVar11._12_4_ + auVar11._12_4_;
        auVar28._8_4_ = 0x40000000;
        auVar28._0_8_ = 0x4000000040000000;
        auVar28._12_4_ = 0x40000000;
        auVar36 = vfmsub213ps_fma(auVar36,auVar26,auVar28);
        auVar11 = vfnmadd213ps_fma(auVar36,auVar11,auVar26);
        *(float *)*pauVar8 = auVar11._0_4_ + -1.0;
        *(float *)((long)*pauVar8 + 4) = auVar11._4_4_ + -1.0;
        *(float *)((long)*pauVar8 + 8) = auVar11._8_4_ + -1.0;
        *(float *)((long)*pauVar8 + 0xc) = auVar11._12_4_ + -1.0;
        pauVar8 = (undefined1 (*) [32])((long)*pauVar8 + 0x10);
        uVar5 = uVar4 + 7;
        uVar4 = uVar4 + 4;
      }
      if (uVar6 - uVar4 != 0 && (int)uVar4 <= (int)uVar6) {
        lVar9 = 0;
        do {
          fVar10 = tanhf(*(float *)((long)*pauVar8 + lVar9 * 4));
          *(float *)((long)*pauVar8 + lVar9 * 4) = fVar10;
          lVar9 = lVar9 + 1;
        } while (uVar6 - uVar4 != (int)lVar9);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar1);
  }
  return 0;
}

Assistant:

int TanH_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = tanh_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = tanh_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = tanh_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = tanh(*ptr);
            ptr++;
        }
    }

    return 0;
}